

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetBit(Reflection *this,Message *message,FieldDescriptor *field)

{
  uint *puVar1;
  uint32 uVar2;
  
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar2 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar2 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_);
    *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
  }
  return;
}

Assistant:

bool HasHasbits() const { return has_bits_offset_ != -1; }